

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

ssize_t __thiscall
httplib::ClientImpl::send(ClientImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t sVar1;
  _Head_base<0UL,_httplib::Response_*,_false> _Var2;
  undefined4 in_register_00000034;
  type res;
  Error error;
  _Head_base<0UL,_httplib::Response_*,_false> local_38;
  undefined4 local_2c;
  __uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_> local_28;
  
  detail::make_unique<httplib::Response>();
  local_2c = 0;
  sVar1 = send((ClientImpl *)CONCAT44(in_register_00000034,__fd),(int)__buf,local_38._M_head_impl,
               (size_t)&local_2c,__flags);
  _Var2._M_head_impl = local_38._M_head_impl;
  if ((char)sVar1 == '\0') {
    _Var2._M_head_impl = (Response *)0x0;
  }
  else {
    local_38._M_head_impl = (Response *)0x0;
  }
  this->_vptr_ClientImpl = (_func_int **)_Var2._M_head_impl;
  local_28._M_t.super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
  .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       (tuple<httplib::Response_*,_std::default_delete<httplib::Response>_>)
       (_Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>)0x0;
  *(undefined4 *)&(this->host_)._M_dataplus._M_p = local_2c;
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            ((unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)&local_28);
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            ((unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)&local_38);
  return (ssize_t)this;
}

Assistant:

inline Result ClientImpl::send(const Request &req) {
		auto res = detail::make_unique<Response>();
		auto error = Error::Success;
		auto ret = send(req, *res, error);
		return Result{ret ? std::move(res) : nullptr, error};
	}